

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readDistribution.hpp
# Opt level: O2

Distribution * __thiscall
njoy::ENDFtk::section::Type<6>::ReactionProduct::
readDistribution<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (Distribution *__return_storage_ptr__,ReactionProduct *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT,int LAW,long lineLaw)

{
  undefined8 *puVar1;
  char *args;
  int MAT_00;
  undefined4 in_stack_0000001c;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  InterpolationSequenceRecord<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>
  local_98;
  
  MAT_00 = (int)lineNumber;
  switch(MT) {
  case 0:
    (__return_storage_ptr__->
    super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ).
    super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ._M_index = '\x01';
    break;
  case 1:
    ContinuumEnergyAngle::
    ContinuumEnergyAngle<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((ContinuumEnergyAngle *)&local_98,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    std::
    variant<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,njoy::ENDFtk::section::Type<6>::Unknown,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ::
    variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,void,void,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,void>
              ((variant<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,njoy::ENDFtk::section::Type<6>::Unknown,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                *)__return_storage_ptr__,(ContinuumEnergyAngle *)&local_98);
    InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
    ::~InterpolationSequenceRecord
              ((InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
                *)&local_98);
    break;
  case 2:
    DiscreteTwoBodyScattering::
    DiscreteTwoBodyScattering<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((DiscreteTwoBodyScattering *)&local_98,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    std::
    variant<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,njoy::ENDFtk::section::Type<6>::Unknown,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ::
    variant<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,void,void,njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,void>
              ((variant<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,njoy::ENDFtk::section::Type<6>::Unknown,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                *)__return_storage_ptr__,(DiscreteTwoBodyScattering *)&local_98);
    InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::TabulatedDistribution>_>
    ::~InterpolationSequenceRecord
              ((InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::TabulatedDistribution>_>
                *)&local_98);
    break;
  case 3:
    (__return_storage_ptr__->
    super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ).
    super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ._M_index = '\x04';
    break;
  case 4:
    (__return_storage_ptr__->
    super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ).
    super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ._M_index = '\x05';
    break;
  case 5:
    ChargedParticleElasticScattering::
    ChargedParticleElasticScattering<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((ChargedParticleElasticScattering *)&local_98,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    std::
    variant<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,njoy::ENDFtk::section::Type<6>::Unknown,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ::
    variant<njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,void,void,njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,void>
              ((variant<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,njoy::ENDFtk::section::Type<6>::Unknown,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                *)__return_storage_ptr__,(ChargedParticleElasticScattering *)&local_98);
    InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearAmplitudeExpansion,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearPlusInterference>_>
    ::~InterpolationSequenceRecord
              ((InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearAmplitudeExpansion,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearPlusInterference>_>
                *)&local_98);
    break;
  case 6:
    NBodyPhaseSpace::NBodyPhaseSpace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((NBodyPhaseSpace *)&local_98,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    std::
    variant<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,njoy::ENDFtk::section::Type<6>::Unknown,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ::
    variant<njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,void,void,njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,void>
              ((variant<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,njoy::ENDFtk::section::Type<6>::Unknown,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                *)__return_storage_ptr__,(NBodyPhaseSpace *)&local_98);
    break;
  case 7:
    LaboratoryAngleEnergy::
    LaboratoryAngleEnergy<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((LaboratoryAngleEnergy *)&local_98,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    std::
    variant<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,njoy::ENDFtk::section::Type<6>::Unknown,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ::
    variant<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy,void,void,njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy,void>
              ((variant<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,njoy::ENDFtk::section::Type<6>::Unknown,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                *)__return_storage_ptr__,(LaboratoryAngleEnergy *)&local_98);
    InterpolationSequenceRecord<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>
    ::~InterpolationSequenceRecord(&local_98);
    break;
  case -0xf:
  case -0xe:
  case -5:
  case -4:
    if (MF == 0x12) {
      DefinedElsewhere::checkLAW(MT);
      *(int *)&(__return_storage_ptr__->
               super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
               ).
               super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
               .
               super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
               .
               super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
               .
               super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
               .
               super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
               ._M_u = MT;
      (__return_storage_ptr__->
      super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      ).
      super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      ._M_index = '\0';
      return __return_storage_ptr__;
    }
    tools::Log::error<char_const*>
              ((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    tools::Log::info<char_const*>
              ((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    args = "MT value: {}";
    MT = MF;
    goto LAB_0014745d;
  default:
    tools::Log::error<char_const*>
              ((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    tools::Log::info<char_const*>
              ((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    args = "LAW value: {}";
LAB_0014745d:
    tools::Log::info<char_const*,int>(args,MT);
    tools::Log::info<char_const*,long>("Line number: {}",CONCAT44(in_stack_0000001c,LAW) + -1);
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = getenv;
    __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
  }
  return __return_storage_ptr__;
}

Assistant:

static Distribution
readDistribution( Iterator& begin,
                  const Iterator& end,
                  long& lineNumber,
                  int MAT,
                  int MF,
                  int MT,
                  int LAW,
                  long lineLaw ) {
  switch ( LAW ) {
    case  -4 :
    case  -5 :
    case -14 :
    case -15 : {
      if ( MT != 18 ) {
        Log::error( "Encountered illegal LAW value for non fission reaction" );
        Log::info( "LAW can only be negative for MT=18" );
        Log::info( "MT value: {}", MT );
        Log::info( "Line number: {}", lineLaw - 1 );
        throw std::exception();
      }
      return DefinedElsewhere( LAW );
    }
    case   0 : return Unknown();
    case   1 : return ContinuumEnergyAngle(
                        begin, end, lineNumber, MAT, MF, MT );
    case   2 : return DiscreteTwoBodyScattering(
                        begin, end, lineNumber, MAT, MF, MT );
    case   3 : return IsotropicDiscreteEmission();
    case   4 : return DiscreteTwoBodyRecoils();
    case   5 : return ChargedParticleElasticScattering(
                        begin, end, lineNumber, MAT, MF, MT );
    case   6 : return NBodyPhaseSpace( begin, end, lineNumber, MAT, MF, MT );
    case   7 : return LaboratoryAngleEnergy(
                        begin, end, lineNumber, MAT, MF, MT );
    default : {
      Log::error( "Encountered illegal LAW value" );
      Log::info( "LAW is negative or equal to a value between 0 and 7" );
      Log::info( "LAW value: {}", LAW );
      Log::info( "Line number: {}", lineLaw - 1 );
      throw std::exception();
    }
  }
}